

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

shared_ptr<Item> __thiscall Player::GetMainHand(Player *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<Item> sVar2;
  shared_ptr<Item> sVar3;
  
  *(element_type **)&(in_RDI->super_MixinContainer).m_mixins._M_t._M_impl =
       (this->m_main_hand_item).super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->m_main_hand_item).super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(in_RDI->super_MixinContainer).m_mixins._M_t._M_impl.super__Rb_tree_header._M_header = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<Item>)sVar2.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Item>)sVar3.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Item> Player::GetMainHand() {
    return m_main_hand_item;
}